

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::SlotI2
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId1,uint32 slotId2,
          ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  ProfileId local_34;
  OpCode local_32 [3];
  ProfileId profileId_local;
  OpCode op_local;
  
  local_34 = profileId;
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3f);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6e8,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007ce3c0;
    *puVar3 = 0;
  }
  value_00 = ConsumeReg(this,value);
  if ((((op - 0x136 < 0xb) && ((0x501U >> (op - 0x136 & 0x1f) & 1) != 0)) || (op == LdInnerSlot)) ||
     (op == LdEnvSlot)) {
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if (bVar2) {
      if (profileId != 0xffff) {
LAB_007ce28c:
        OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
        op = local_32[0];
      }
    }
    else {
      bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
      if (bVar2 && profileId != 0xffff) goto LAB_007ce28c;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6fc,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) goto LAB_007ce3c0;
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,value_00,slotId1,slotId2);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,local_32[0],value_00,slotId1,slotId2), !bVar2)) &&
     (bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,local_32[0],value_00,slotId1,slotId2), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x701,"(success)","success");
    if (!bVar2) {
LAB_007ce3c0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::IsProfiledOp(local_32[0]);
  if (bVar2) {
    Data::Write(&this->m_byteCodeData,&local_34,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::SlotI2(OpCode op, RegSlot value, uint32 slotId1, uint32 slotId2, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI2, op, value, slotId1, slotId2);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }